

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depthwise_convolution.c
# Opt level: O0

rt_function_error_t free_depthwise_convolution_local_context(rt_function_t *f)

{
  var_t *var;
  rt_list_t s;
  rt_list_t s_00;
  rt_list_t s_01;
  rt_list_t s_02;
  rt_list_t s_03;
  convolution_private_t *p;
  depthwise_convolution_local_context_t *c;
  rt_function_t *f_local;
  
  var = *f->local_context;
  var_free(var);
  var_free(var + 1);
  var_free(var + 2);
  if (var[3].v != (rt_variable_t *)0x0) {
    var_free(var + 3);
  }
  if (var[4].v != (rt_variable_t *)0x0) {
    var_free(var + 4);
  }
  s._4_4_ = 0;
  s.size = var[5].shape.size;
  s.data = var[5].shape.data;
  free_list(s);
  s_00._4_4_ = 0;
  s_00.size = var[5].stride.size;
  s_00.data = var[5].stride.data;
  free_list(s_00);
  s_01._4_4_ = 0;
  s_01.size = var[5].offset;
  s_01.data = (int *)var[6].v;
  free_list(s_01);
  s_02._4_4_ = 0;
  s_02.size = var[6].shape.size;
  s_02.data = var[6].shape.data;
  free_list(s_02);
  s_03._4_4_ = 0;
  s_03.size = *(uint *)&var[5].set;
  s_03.data = (int *)var[5].get;
  free_list(s_03);
  (*rt_free_func)(var);
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t free_depthwise_convolution_local_context(rt_function_t *f) {
  depthwise_convolution_local_context_t *c =
      (depthwise_convolution_local_context_t *)(f->local_context);
  convolution_private_t *p = (convolution_private_t *)c->data;
  var_free(&p->out_var);
  var_free(&p->in_var);
  var_free(&p->w_var);
  if (p->b_var.v != 0)
    var_free(&p->b_var);
  if (p->a_var.v != 0)
    var_free(&p->a_var);
  free_list(p->input_shape);
  free_list(p->kernel_shape);
  free_list(p->in_position);
  free_list(p->out_position);
  free_list(p->output_shape);
  rt_free_func(p);
  return RT_FUNCTION_ERROR_NOERROR;
}